

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O3

Move * cuddZddSiftingDown(DdManager *table,int x,int x_high,int initial_size)

{
  int iVar1;
  DdNode *pDVar2;
  int limit_size;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdHalfWord y;
  double dVar5;
  
  if (x_high <= x) {
    return (Move *)0x0;
  }
  pDVar3 = (DdNode *)0x0;
  while( true ) {
    y = x + 1;
    iVar1 = cuddZddSwapInPlace(table,x,y);
    if ((iVar1 == 0) || (pDVar2 = cuddDynamicAllocNode(table), pDVar2 == (DdNode *)0x0)) {
      if (pDVar3 != (DdNode *)0x0) {
        pDVar2 = table->nextFree;
        do {
          pDVar4 = pDVar3;
          pDVar3 = (pDVar4->type).kids.T;
          pDVar4->ref = 0;
          pDVar4->next = pDVar2;
          pDVar2 = pDVar4;
        } while (pDVar3 != (DdNode *)0x0);
        table->nextFree = pDVar4;
      }
      return (Move *)0x0;
    }
    pDVar2->index = x;
    pDVar2->ref = y;
    *(int *)((long)&pDVar2->next + 4) = iVar1;
    dVar5 = (double)initial_size;
    (pDVar2->type).kids.T = pDVar3;
    if (iVar1 < initial_size) {
      initial_size = iVar1;
    }
    if (dVar5 * table->maxGrowth < (double)iVar1) break;
    pDVar3 = pDVar2;
    x = y;
    if (y == x_high) {
      return (Move *)pDVar2;
    }
  }
  return (Move *)pDVar2;
}

Assistant:

static Move *
cuddZddSiftingDown(
  DdManager * table,
  int  x,
  int  x_high,
  int  initial_size)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         limit_size = initial_size;

    moves = NULL;
    y = cuddZddNextHigh(table, x);
    while (y <= x_high) {
        size = cuddZddSwapInPlace(table, x, y);
        if (size == 0)
            goto cuddZddSiftingDownOutOfMem;
        move = (Move *)cuddDynamicAllocNode(table);
        if (move == NULL)
            goto cuddZddSiftingDownOutOfMem;
        move->x = x;
        move->y = y;
        move->size = size;
        move->next = moves;
        moves = move;

        if ((double)size > (double)limit_size * table->maxGrowth)
            break;
        if (size < limit_size)
            limit_size = size;

        x = y;
        y = cuddZddNextHigh(table, x);
    }
    return(moves);

cuddZddSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(NULL);

}